

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

void boost::filesystem::path::m_path_iterator_increment(iterator *it)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  pointer pcVar4;
  ulong uVar5;
  string_type *str;
  bool bVar6;
  long *local_30 [2];
  long local_20 [2];
  
  str = &it->m_path_ptr->m_pathname;
  uVar1 = str->_M_string_length;
  if (uVar1 <= it->m_pos) {
    __assert_fail("(it.m_pos < it.m_path_ptr->m_pathname.size())&&(\"path::basic_iterator increment past end()\")"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/path.cpp"
                  ,0x2f8,
                  "static void boost::filesystem::path::m_path_iterator_increment(path::iterator &)"
                 );
  }
  uVar2 = (it->m_element).m_pathname._M_string_length;
  uVar5 = it->m_pos + uVar2;
  it->m_pos = uVar5;
  if (uVar5 == uVar1) {
    (it->m_element).m_pathname._M_string_length = 0;
    *(it->m_element).m_pathname._M_dataplus._M_p = '\0';
  }
  else {
    if (((uVar2 < 3) || (pcVar3 = (it->m_element).m_pathname._M_dataplus._M_p, *pcVar3 != '/')) ||
       (pcVar3[1] != '/')) {
      bVar6 = false;
    }
    else {
      bVar6 = pcVar3[2] != '/';
    }
    pcVar4 = (str->_M_dataplus)._M_p;
    if (pcVar4[uVar5] == '/') {
      if (bVar6) {
        std::__cxx11::string::_M_replace_aux((ulong)it,0,uVar2,'\x01');
        return;
      }
      do {
        if (pcVar4[uVar5] != '/') goto LAB_00110606;
        uVar5 = uVar5 + 1;
        it->m_pos = uVar5;
      } while (uVar1 != uVar5);
      bVar6 = anon_unknown.dwarf_1d6a5::is_root_separator(str,uVar1 - 1);
      if (!bVar6) {
        it->m_pos = it->m_pos - 1;
        detail::dot_path();
        std::__cxx11::string::_M_assign((string *)it);
        return;
      }
      str = &it->m_path_ptr->m_pathname;
      uVar5 = it->m_pos;
    }
LAB_00110606:
    std::__cxx11::string::find_first_of((char *)str,0x11402c,uVar5);
    std::__cxx11::string::substr((ulong)local_30,(ulong)it->m_path_ptr);
    std::__cxx11::string::_M_assign((string *)it);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  return;
}

Assistant:

void path::m_path_iterator_increment(path::iterator & it)
  {
    BOOST_ASSERT_MSG(it.m_pos < it.m_path_ptr->m_pathname.size(),
      "path::basic_iterator increment past end()");

    // increment to position past current element; if current element is implicit dot,
    // this will cause it.m_pos to represent the end iterator
    it.m_pos += it.m_element.m_pathname.size();

    // if the end is reached, we are done
    if (it.m_pos == it.m_path_ptr->m_pathname.size())
    {
      it.m_element.clear();  // aids debugging, may release unneeded memory
      return;
    }

    // both POSIX and Windows treat paths that begin with exactly two separators specially
    bool was_net(it.m_element.m_pathname.size() > 2
      && is_separator(it.m_element.m_pathname[0])
      && is_separator(it.m_element.m_pathname[1])
      && !is_separator(it.m_element.m_pathname[2]));

    // process separator (Windows drive spec is only case not a separator)
    if (is_separator(it.m_path_ptr->m_pathname[it.m_pos]))
    {
      // detect root directory
      if (was_net
#       ifdef BOOST_WINDOWS_API
        // case "c:/"
        || it.m_element.m_pathname[it.m_element.m_pathname.size()-1] == colon
#       endif
         )
      {
        it.m_element.m_pathname = separator;  // generic format; see docs
        return;
      }

      // skip separators until it.m_pos points to the start of the next element
      while (it.m_pos != it.m_path_ptr->m_pathname.size()
        && is_separator(it.m_path_ptr->m_pathname[it.m_pos]))
        { ++it.m_pos; }

      // detect trailing separator, and treat it as ".", per POSIX spec
      if (it.m_pos == it.m_path_ptr->m_pathname.size()
        && !is_root_separator(it.m_path_ptr->m_pathname, it.m_pos-1)) 
      {
        --it.m_pos;
        it.m_element = detail::dot_path();
        return;
      }
    }

    // get m_element
    size_type end_pos(it.m_path_ptr->m_pathname.find_first_of(separators, it.m_pos));
    if (end_pos == string_type::npos)
      end_pos = it.m_path_ptr->m_pathname.size();
    it.m_element = it.m_path_ptr->m_pathname.substr(it.m_pos, end_pos - it.m_pos);
  }